

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

token_vector * cpptempl::tokenize(string *text,token_vector *tokens)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  TokenVar *pTVar7;
  TokenText *__p;
  TokenFor *pTVar8;
  char *__end;
  undefined8 uVar9;
  pointer psVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  string expression;
  string pre_text;
  shared_ptr<cpptempl::Token> local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [40];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  undefined1 local_108 [24];
  TokenVar *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  shared_ptr<cpptempl::Token> local_80;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_168._16_8_ = tokens;
  do {
    if (text->_M_string_length == 0) {
      return (token_vector *)
             (vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
              *)local_168._16_8_;
    }
    lVar6 = std::__cxx11::string::find((char *)text,0x1f52b6,0);
    if (lVar6 == -1) {
      sVar2 = text->_M_string_length;
      if (sVar2 != 0) {
        __p = (TokenText *)operator_new(0x28);
        local_b0 = local_a0;
        pcVar3 = (text->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar3,pcVar3 + sVar2);
        (__p->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b820;
        (__p->m_text)._M_dataplus._M_p = (pointer)&(__p->m_text).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__p->m_text,local_b0,local_a8 + (long)local_b0);
        local_168._24_8_ = __p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 0x20),__p);
        std::
        vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>::
        emplace_back<std::shared_ptr<cpptempl::Token>>
                  ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                    *)local_168._16_8_,(shared_ptr<cpptempl::Token> *)(local_168 + 0x18));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._32_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._32_8_);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
      }
      bVar4 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)(local_168 + 0x18),(ulong)text);
      uVar9 = local_168._32_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._32_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pTVar7 = (TokenVar *)operator_new(0x28);
        local_d0 = local_c8._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_168._24_8_,uVar9 + local_168._24_8_);
        (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b820;
        (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar7->m_key,local_d0,local_d0 + local_c8._M_allocated_capacity);
        local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                  (&local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(TokenText *)pTVar7);
        std::
        vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>::
        emplace_back<std::shared_ptr<cpptempl::Token>>
                  ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                    *)local_168._16_8_,&local_198);
        if (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_d0 != local_c8._M_local_buf + 8) {
          operator_delete(local_d0,local_c8._8_8_ + 1);
        }
      }
      std::__cxx11::string::substr((ulong)&local_198,(ulong)text);
      std::__cxx11::string::operator=((string *)text,(string *)&local_198);
      if ((TokenVar *)
          local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (TokenVar *)local_188) {
        operator_delete(local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_188._0_8_ + 1);
      }
      bVar12 = text->_M_string_length == 0;
      bVar4 = !bVar12;
      if (bVar12) {
        pTVar7 = (TokenVar *)operator_new(0x28);
        local_f0 = (TokenVar *)local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"{","");
        (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b820;
        (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar7->m_key,local_f0,
                   (long)&(local_f0->super_Token)._vptr_Token + local_e8);
        local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                  (&local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(TokenText *)pTVar7);
        std::
        vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>::
        emplace_back<std::shared_ptr<cpptempl::Token>>
                  ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                    *)local_168._16_8_,&local_198);
        if (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        psVar10 = (pointer)local_e0._0_8_;
        pTVar7 = local_f0;
        if (local_f0 != (TokenVar *)local_e0) {
LAB_00148019:
          operator_delete(pTVar7,(ulong)((long)&(psVar10->
                                                super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + 1));
        }
      }
      else {
        cVar1 = *(text->_M_dataplus)._M_p;
        if (cVar1 == '%') {
          lVar6 = std::__cxx11::string::find((char *)text,0x17c537,0);
          if (lVar6 != -1) {
            std::__cxx11::string::substr((ulong)local_178,(ulong)text);
            nonius::trim_copy_if<nonius::detail::is_spaceF>(&local_198,local_178);
            if ((TokenFor *)local_178._0_8_ != (TokenFor *)local_168) {
              operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
            }
            std::__cxx11::string::substr((ulong)local_178,(ulong)text);
            std::__cxx11::string::operator=((string *)text,(string *)local_178);
            if ((TokenFor *)local_178._0_8_ != (TokenFor *)local_168) {
              operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
            }
            local_178._0_8_ = local_168;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"for","");
            if (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi < (ulong)local_178._8_8_) {
              bVar12 = false;
            }
            else if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ ==
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar12 = true;
            }
            else {
              iVar5 = bcmp((void *)local_178._0_8_,
                           local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,local_178._8_8_);
              bVar12 = iVar5 == 0;
            }
            if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
              operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
            }
            if (bVar12) {
              pTVar8 = (TokenFor *)operator_new(0x60);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,
                         local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(long)&((Token *)
                                       &(local_198.
                                         super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->_vptr_Token)->_vptr_Token +
                                (long)&(local_198.
                                        super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base);
              TokenFor::TokenFor(pTVar8,&local_70);
              local_178._0_8_ = pTVar8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenFor*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8),pTVar8);
              std::
              vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
              ::emplace_back<std::shared_ptr<cpptempl::Token>>
                        ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                          *)local_168._16_8_,(shared_ptr<cpptempl::Token> *)local_178);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
              }
              uVar9 = local_70.field_2._M_allocated_capacity;
              _Var11._M_p = local_70._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00147ffe;
            }
            else {
              local_178._0_8_ = local_168;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"if","");
              if (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi < (ulong)local_178._8_8_) {
                bVar12 = false;
              }
              else if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ ==
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                bVar12 = true;
              }
              else {
                iVar5 = bcmp((void *)local_178._0_8_,
                             local_198.
                             super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             local_178._8_8_);
                bVar12 = iVar5 == 0;
              }
              if ((element_type *)local_178._0_8_ != (element_type *)local_168) {
                operator_delete((void *)local_178._0_8_,local_168._0_8_ + 1);
              }
              if (bVar12) {
                pTVar8 = (TokenFor *)operator_new(0x40);
                local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_108 + 8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,
                           local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(long)&((Token *)
                                          &(local_198.
                                            super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_vptr_Token)->_vptr_Token +
                                   (long)&(local_198.
                                           super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_vptr__Sp_counted_base);
                (pTVar8->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b8b0;
                (pTVar8->m_key)._M_dataplus._M_p = (pointer)&(pTVar8->m_key).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&pTVar8->m_key,local_110,(long)local_110 + local_108._0_8_);
                (pTVar8->m_val)._M_dataplus._M_p = (pointer)0x0;
                (pTVar8->m_val)._M_string_length = 0;
                (pTVar8->m_val).field_2._M_allocated_capacity = 0;
                local_178._0_8_ = pTVar8;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenIf*>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8),
                           (TokenIf *)pTVar8);
                std::
                vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                ::emplace_back<std::shared_ptr<cpptempl::Token>>
                          ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                            *)local_168._16_8_,(shared_ptr<cpptempl::Token> *)local_178);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
                }
                uVar9 = local_108._8_8_;
                _Var11._M_p = (pointer)local_110;
                if (local_110 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_108 + 8)) {
LAB_00147ffe:
                  operator_delete(_Var11._M_p,
                                  (ulong)((long)&((element_type *)uVar9)->_vptr_Token + 1));
                }
              }
              else {
                pTVar8 = (TokenFor *)operator_new(0x28);
                nonius::trim_copy_if<nonius::detail::is_spaceF>(&local_90,&local_198);
                (pTVar8->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b8f8;
                (pTVar8->m_key)._M_dataplus._M_p = (pointer)&(pTVar8->m_key).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&pTVar8->m_key,local_90,(long)local_90 + local_88);
                local_178._0_8_ = pTVar8;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenEnd*>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8),
                           (TokenEnd *)pTVar8);
                std::
                vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                ::emplace_back<std::shared_ptr<cpptempl::Token>>
                          ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                            *)local_168._16_8_,(shared_ptr<cpptempl::Token> *)local_178);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
                }
                uVar9 = local_80.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
                _Var11._M_p = (pointer)local_90;
                if (local_90 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_80) goto LAB_00147ffe;
              }
            }
LAB_00148006:
            psVar10 = (pointer)local_188._0_8_;
            pTVar7 = (TokenVar *)
                     local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((TokenVar *)
                local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (TokenVar *)local_188) goto LAB_00148019;
          }
        }
        else if (cVar1 == '$') {
          lVar6 = std::__cxx11::string::find((char *)text,0x17c537,0);
          if (lVar6 != -1) {
            pTVar7 = (TokenVar *)operator_new(0x28);
            std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
            (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b868;
            (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pTVar7->m_key,local_50,local_48 + (long)local_50);
            local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pTVar7;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenVar*>
                      (&local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,pTVar7);
            std::
            vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
            ::emplace_back<std::shared_ptr<cpptempl::Token>>
                      ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                        *)local_168._16_8_,&local_198);
            if (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            std::__cxx11::string::substr((ulong)&local_198,(ulong)text);
            std::__cxx11::string::operator=((string *)text,(string *)&local_198);
            goto LAB_00148006;
          }
        }
        else {
          pTVar7 = (TokenVar *)operator_new(0x28);
          local_130._0_8_ = local_120;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"{","");
          (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b820;
          (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar7->m_key,local_130._0_8_,local_130._8_8_ + local_130._0_8_);
          local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pTVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                    (&local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(TokenText *)pTVar7);
          std::
          vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
          ::emplace_back<std::shared_ptr<cpptempl::Token>>
                    ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                      *)local_168._16_8_,&local_198);
          if (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_198.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          psVar10 = (pointer)local_120._0_8_;
          pTVar7 = (TokenVar *)local_130._0_8_;
          if ((TokenVar *)local_130._0_8_ != (TokenVar *)local_120) goto LAB_00148019;
        }
      }
      if ((TokenText *)local_168._24_8_ != (TokenText *)local_140) {
        operator_delete((void *)local_168._24_8_,(ulong)(local_140._0_8_ + 1));
      }
    }
    if (!bVar4) {
      return (token_vector *)
             (vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
              *)local_168._16_8_;
    }
  } while( true );
}

Assistant:

inline token_vector & tokenize(std::string text, token_vector &tokens)
    {
        while(! text.empty())
        {
            size_t pos = text.find("{") ;
            if (pos == std::string::npos)
            {
                if (! text.empty())
                {
                    tokens.push_back(token_ptr(new TokenText(text))) ;
                }
                return tokens ;
            }
            std::string pre_text = text.substr(0, pos) ;
            if (! pre_text.empty())
            {
                tokens.push_back(token_ptr(new TokenText(pre_text))) ;
            }
            text = text.substr(pos+1) ;
            if (text.empty())
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
                return tokens ;
            }

            // variable
            if (text[0] == '$')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    tokens.push_back(token_ptr (new TokenVar(text.substr(1, pos-1)))) ;
                    text = text.substr(pos+1) ;
                }
            }
            // control statement
            else if (text[0] == '%')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    std::string expression = nonius::trim_copy(text.substr(1, pos-2)) ;
                    text = text.substr(pos+1) ;
                    if (nonius::starts_with(expression, "for"))
                    {
                        tokens.push_back(token_ptr (new TokenFor(expression))) ;
                    }
                    else if (nonius::starts_with(expression, "if"))
                    {
                        tokens.push_back(token_ptr (new TokenIf(expression))) ;
                    }
                    else
                    {
                        tokens.push_back(token_ptr (new TokenEnd(nonius::trim_copy(expression)))) ;
                    }
                }
            }
            else
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
            }
        }
        return tokens ;
    }